

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int find_quote(char **string)

{
  char *tstr;
  char **string_local;
  
  tstr = *string;
  while( true ) {
    if (*tstr == '\0') {
      return 1;
    }
    if (*tstr == '\'') break;
    tstr = tstr + 1;
  }
  *string = tstr + 1;
  return 0;
}

Assistant:

static int find_quote(char **string)

/*  
    look for the closing single quote character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {
        if (*tstr == '\'') { /* found the closing quote */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else {  /* skip over any other character */
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}